

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<kj::PathPtr,char>(String *__return_storage_ptr__,kj *this,PathPtr *params,char *params_1)

{
  undefined8 this_00;
  String local_31;
  
  this_00 = (long)&local_31.content.ptr + 1;
  toCharSequence<kj::PathPtr>((String *)this_00,(PathPtr *)this);
  local_31.content.ptr._0_1_ = *(undefined1 *)&(params->parts).ptr;
  _::concat<kj::String,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)this_00,&local_31,(FixedArray<char,_1UL> *)params_1);
  Array<char>::~Array((Array<char> *)((long)&local_31.content.ptr + 1));
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}